

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

Emulator * emulator_new(EmulatorInit *init)

{
  ulong uVar1;
  size_t sVar2;
  Result RVar3;
  Emulator *e;
  
  e = (Emulator *)calloc(1,0x82d08);
  uVar1 = (init->rom).size;
  if (uVar1 == 0) {
    emulator_new_cold_2();
  }
  else if ((uVar1 & 0x7fff) == 0) {
    sVar2 = (init->rom).size;
    (e->file_data).data = (init->rom).data;
    (e->file_data).size = sVar2;
    RVar3 = init_emulator(e,init);
    if ((RVar3 == OK) &&
       (RVar3 = init_audio_buffer(e,init->audio_frequency,init->audio_frames), RVar3 == OK)) {
      return e;
    }
  }
  else {
    emulator_new_cold_1();
  }
  emulator_delete(e);
  return (Emulator *)0x0;
}

Assistant:

Emulator* emulator_new(const EmulatorInit* init) {
  Emulator* e = xcalloc(1, sizeof(Emulator));
  CHECK(SUCCESS(set_rom_file_data(e, &init->rom)));
  CHECK(SUCCESS(init_emulator(e, init)));
  CHECK(
      SUCCESS(init_audio_buffer(e, init->audio_frequency, init->audio_frames)));
  return e;
error:
  emulator_delete(e);
  return NULL;
}